

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O0

void __thiscall
vkt::geometry::GraphicsPipelineBuilder::~GraphicsPipelineBuilder(GraphicsPipelineBuilder *this)

{
  GraphicsPipelineBuilder *this_local;
  
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector(&this->m_vertexInputAttributes);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector(&this->m_vertexInputBindings);
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~vector(&this->m_shaderStages);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            (&this->m_tessEvaluationShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_tessControlShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_geometryShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_vertexShaderModule);
  return;
}

Assistant:

GraphicsPipelineBuilder	(void) : m_renderSize			(0, 0)
															   , m_shaderStageFlags		(0u)
															   , m_cullModeFlags		(vk::VK_CULL_MODE_NONE)
															   , m_frontFace			(vk::VK_FRONT_FACE_COUNTER_CLOCKWISE)
															   , m_patchControlPoints	(1u)
															   , m_blendEnable			(false)
															   , m_primitiveTopology	(vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {}